

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindProgramCommand.cxx
# Opt level: O2

void __thiscall
cmFindProgramHelper::cmFindProgramHelper
          (cmFindProgramHelper *this,string *debugName,cmMakefile *makefile,cmFindBase *base)

{
  PolicyStatus PVar1;
  string sStack_48;
  
  (this->Extensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Extensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Extensions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->BestPath)._M_dataplus._M_p = (pointer)&(this->BestPath).field_2;
  (this->BestPath)._M_string_length = 0;
  (this->BestPath).field_2._M_local_buf[0] = '\0';
  (this->Names).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Names).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Names).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->TestNameExt)._M_dataplus._M_p = (pointer)&(this->TestNameExt).field_2;
  (this->TestNameExt)._M_string_length = 0;
  (this->TestNameExt).field_2._M_local_buf[0] = '\0';
  (this->TestPath)._M_dataplus._M_p = (pointer)&(this->TestPath).field_2;
  (this->TestPath)._M_string_length = 0;
  (this->TestPath).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&sStack_48,(string *)debugName);
  cmFindBaseDebugState::cmFindBaseDebugState(&this->DebugSearches,&sStack_48,base);
  std::__cxx11::string::~string((string *)&sStack_48);
  this->Makefile = makefile;
  this->FindBase = base;
  PVar1 = cmMakefile::GetPolicyStatus(makefile,CMP0109,false);
  this->PolicyCMP0109 = PVar1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::emplace_back<>(&this->Extensions);
  return;
}

Assistant:

cmFindProgramHelper(std::string debugName, cmMakefile* makefile,
                      cmFindBase const* base)
    : DebugSearches(std::move(debugName), base)
    , Makefile(makefile)
    , FindBase(base)
    , PolicyCMP0109(makefile->GetPolicyStatus(cmPolicies::CMP0109))
  {
#if defined(_WIN32) || defined(__CYGWIN__) || defined(__MINGW32__)
    // Consider platform-specific extensions.
    this->Extensions.push_back(".com");
    this->Extensions.push_back(".exe");
#endif
    // Consider original name with no extensions.
    this->Extensions.emplace_back();
  }